

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

uint64_t __thiscall fmp4_stream::trun::size(trun *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = (ulong)(uint)(*(int *)&(this->super_full_box).field_0x6c << 2);
  uVar5 = 0;
  if (this->sample_duration_present_ != false) {
    uVar5 = uVar3;
  }
  uVar2 = 0;
  if (this->sample_size_present_ != false) {
    uVar2 = uVar3;
  }
  uVar1 = 0;
  if (this->sample_flags_present_ != false) {
    uVar1 = uVar3;
  }
  uVar4 = 0;
  if (this->sample_composition_time_offsets_present_ != false) {
    uVar4 = uVar3;
  }
  return uVar1 + uVar2 + uVar5 +
                 (ulong)((uint)(this->super_full_box).super_box.has_uuid_ * 0x10 +
                         (uint)(this->super_full_box).super_box.is_large_ * 8 +
                        (uint)this->data_offset_present_ * 4) +
                 (ulong)this->first_sample_flags_present_ * 4 + uVar4 + 0x10;
}

Assistant:

uint64_t box::size()  const {
		uint64_t l_size = 8;
		if (is_large_)
			l_size += 8;
		if (has_uuid_)
			l_size += 16;
		return l_size;
	}